

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O2

void tchecker::syncprod::attributes
               (system_t *system,transition_t *t,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *m)

{
  tchecker *this;
  mapped_type *pmVar1;
  system_t *in_RCX;
  allocator<char> local_6a;
  allocator<char> local_69;
  key_type local_68;
  string local_48;
  
  this = (tchecker *)
         intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::
         operator*(&t->_vedge);
  to_string_abi_cxx11_(&local_48,this,(vedge_t *)system,in_RCX);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"vedge",&local_6a);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](m,&local_68);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  if (t->_sync_id == 0xffffffff) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_6a);
  }
  else {
    to_string_abi_cxx11_(&local_48,(tchecker *)(ulong)t->_sync_id,(sync_id_t)system,in_RCX);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"sync",&local_69);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](m,&local_68);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void attributes(tchecker::syncprod::system_t const & system, tchecker::syncprod::transition_t const & t,
                std::map<std::string, std::string> & m)
{
  m["vedge"] = tchecker::to_string(t.vedge(), system.as_system_system());
  m["sync"] = (t.sync_id() == tchecker::NO_SYNC ? "" : tchecker::to_string(t.sync_id(), system.as_system_system()));
}